

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5c29f0::ECCurveTest_Compare_Test::TestBody(ECCurveTest_Compare_Test *this)

{
  bool bVar1;
  int iVar2;
  ParamType_conflict *pPVar3;
  EC_POINT *p_00;
  EC_POINT *b;
  point_conversion_form_t form;
  int *lhs;
  pointer *__ptr;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr_4;
  pointer *__ptr_11;
  AssertionResult gtest_ar__4;
  UniquePtr<EC_POINT> inf1;
  AssertionResult gtest_ar;
  UniquePtr<EC_POINT> q;
  UniquePtr<EC_POINT> p;
  UniquePtr<EC_POINT> inf2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serialized;
  UniquePtr<EC_KEY> key2;
  UniquePtr<EC_KEY> key1;
  AssertHelper local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  _Head_base<0UL,_ec_point_st_*,_false> local_a8;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Head_base<0UL,_ec_point_st_*,_false> local_80;
  AssertHelper local_78;
  _Head_base<0UL,_ec_point_st_*,_false> local_70;
  _Head_base<0UL,_ec_point_st_*,_false> local_68;
  AssertHelper local_60;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_50;
  pointer local_48;
  unique_ptr<ec_key_st,_bssl::internal::Deleter> local_38;
  unique_ptr<ec_key_st,_bssl::internal::Deleter> local_30;
  
  pPVar3 = testing::WithParamInterface<int>::GetParam();
  local_30._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
       EC_KEY_new_by_curve_name(*pPVar3);
  local_58[0] = (tuple<ec_key_st_*,_bssl::internal::Deleter>)
                local_30._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
                (_Head_base<0UL,_ec_key_st_*,_false>)0x0;
  pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
      local_30._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)local_58,(AssertionResult *)0x546fa0,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x265,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_b8);
  }
  else {
    iVar2 = EC_KEY_generate_key((EC_KEY *)
                                local_30._M_t.
                                super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
    local_58[0] = iVar2 != 0;
    pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 != 0) {
      p_00 = (EC_POINT *)
             EC_KEY_get0_public_key
                       ((EC_KEY *)
                        local_30._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t
                        .super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
      pPVar3 = testing::WithParamInterface<int>::GetParam();
      local_38._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
           EC_KEY_new_by_curve_name(*pPVar3);
      local_58[0] = (tuple<ec_key_st_*,_bssl::internal::Deleter>)
                    local_38._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
                    (_Head_base<0UL,_ec_key_st_*,_false>)0x0;
      pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
          local_38._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&local_b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_a0,(internal *)local_58,(AssertionResult *)0x555743,"false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x26a,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_b8);
LAB_002e4bf7:
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_a0._1_7_,local_a0[0]),local_90._M_allocated_capacity + 1
                         );
        }
        if ((long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) + 8))();
        }
        if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&pbStack_50,pbStack_50);
        }
      }
      else {
        iVar2 = EC_KEY_generate_key((EC_KEY *)
                                    local_38._M_t.
                                    super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        local_58[0] = iVar2 != 0;
        pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_b8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a0,(internal *)local_58,
                     (AssertionResult *)"EC_KEY_generate_key(key2.get())","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x26b,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_b8)
          ;
          goto LAB_002e4bf7;
        }
        b = EC_KEY_get0_public_key
                      ((EC_KEY *)
                       local_38._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
        local_58._0_4_ = 1;
        local_b8.data_._0_4_ =
             EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,(EC_POINT *)p_00,b,
                          (BN_CTX *)0x0);
        lhs = (int *)local_58;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_a0,"1","EC_POINT_cmp(group(), pub1, pub2, nullptr)",lhs,
                   (int *)&local_b8);
        form = (point_conversion_form_t)lhs;
        if (local_a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_58);
          if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = "";
          }
          else {
            pcVar4 = (local_98->_M_dataplus)._M_p;
          }
          form = 0x26f;
          testing::internal::AssertHelper::AssertHelper
                    (&local_b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x26f,pcVar4);
          testing::internal::AssertHelper::operator=(&local_b8,(Message *)local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_b8);
          if (local_58 != (undefined1  [8])0x0) {
            (**(code **)(*(long *)local_58 + 8))();
          }
        }
        if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_98,local_98);
        }
        local_58 = (undefined1  [8])0x0;
        pbStack_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_48 = (pointer)0x0;
        bVar1 = EncodeECPoint((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
                              (this->super_ECCurveTest).group_,p_00,form);
        local_b8.data_._0_4_ = CONCAT31(local_b8.data_._1_3_,bVar1);
        local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (bVar1) {
LAB_002e4d84:
          local_70._M_head_impl =
               (ec_point_st *)EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
          local_b8.data_._0_4_ =
               CONCAT31(local_b8.data_._1_3_,local_70._M_head_impl != (ec_point_st *)0x0);
          local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_70._M_head_impl == (ec_point_st *)0x0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_a0,(internal *)&local_b8,(AssertionResult *)0x56dfbc,"false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_a8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                       ,0x277,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_a8,(Message *)&local_80);
LAB_002e5055:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_a0._1_7_,local_a0[0]),
                              local_90._M_allocated_capacity + 1);
            }
            if (local_80._M_head_impl != (ec_point_st *)0x0) {
              (*(code *)((local_80._M_head_impl)->group->generator).group)();
            }
            if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_b0,local_b0);
            }
          }
          else {
            iVar2 = EC_POINT_oct2point((EC_GROUP *)(this->super_ECCurveTest).group_,
                                       (EC_POINT *)local_70._M_head_impl,(uchar *)local_58,
                                       (long)pbStack_50 - (long)local_58,(BN_CTX *)0x0);
            local_b8.data_._0_4_ = CONCAT31(local_b8.data_._1_3_,iVar2 != 0);
            local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar2 == 0) {
              testing::Message::Message((Message *)&local_80);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_a0,(internal *)&local_b8,
                         (AssertionResult *)
                         "EC_POINT_oct2point(group(), p.get(), serialized.data(), serialized.size(), nullptr)"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x279,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_a8,(Message *)&local_80);
              goto LAB_002e5055;
            }
            local_b8.data_._0_4_ = 0;
            iVar2 = EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                 (EC_POINT *)local_70._M_head_impl,(EC_POINT *)p_00,(BN_CTX *)0x0);
            local_80._M_head_impl._0_4_ = iVar2;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_a0,"0","EC_POINT_cmp(group(), p.get(), pub1, nullptr)",
                       (int *)&local_b8,(int *)&local_80);
            if (local_a0[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_b8);
              if (local_98 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (local_98->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_80,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x27c,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_80,(Message *)&local_b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
              if ((long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) + 8))();
              }
            }
            if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_98,local_98);
            }
            iVar2 = EC_POINT_add((EC_GROUP *)(this->super_ECCurveTest).group_,
                                 (EC_POINT *)local_70._M_head_impl,(EC_POINT *)local_70._M_head_impl
                                 ,b,(BN_CTX *)0x0);
            local_b8.data_._0_4_ = CONCAT31(local_b8.data_._1_3_,iVar2 != 0);
            local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar2 == 0) {
              testing::Message::Message((Message *)&local_80);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_a0,(internal *)&local_b8,
                         (AssertionResult *)"EC_POINT_add(group(), p.get(), p.get(), pub2, nullptr)"
                         ,"false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_a8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x27f,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_a8,(Message *)&local_80);
              goto LAB_002e5055;
            }
            local_b8.data_._0_4_ = 1;
            iVar2 = EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                 (EC_POINT *)local_70._M_head_impl,(EC_POINT *)p_00,(BN_CTX *)0x0);
            local_80._M_head_impl._0_4_ = iVar2;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_a0,"1","EC_POINT_cmp(group(), p.get(), pub1, nullptr)",
                       (int *)&local_b8,(int *)&local_80);
            if (local_a0[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_b8);
              if (local_98 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = (local_98->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_80,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x280,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_80,(Message *)&local_b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
              if ((long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) + 8))();
              }
            }
            if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_98,local_98);
            }
            local_80._M_head_impl =
                 (ec_point_st *)EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
            local_b8.data_._0_4_ =
                 CONCAT31(local_b8.data_._1_3_,local_80._M_head_impl != (ec_point_st *)0x0);
            local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_80._M_head_impl == (ec_point_st *)0x0) {
              testing::Message::Message((Message *)&local_a8);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_a0,(internal *)&local_b8,(AssertionResult *)0x582c2f,
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_68,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                         ,0x285,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_68,(Message *)&local_a8);
LAB_002e544d:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_a0._1_7_,local_a0[0]),
                                local_90._M_allocated_capacity + 1);
              }
              if (local_a8._M_head_impl != (ec_point_st *)0x0) {
                (*(code *)((local_a8._M_head_impl)->group->generator).group)();
              }
              if (local_b0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_b0,local_b0);
              }
            }
            else {
              iVar2 = EC_POINT_copy((EC_POINT *)local_80._M_head_impl,b);
              local_b8.data_._0_4_ = CONCAT31(local_b8.data_._1_3_,iVar2 != 0);
              local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_a8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_a0,(internal *)&local_b8,
                           (AssertionResult *)"EC_POINT_copy(q.get(), pub2)","false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_68,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x286,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_68,(Message *)&local_a8);
                goto LAB_002e544d;
              }
              iVar2 = EC_POINT_invert((EC_GROUP *)(this->super_ECCurveTest).group_,
                                      (EC_POINT *)local_80._M_head_impl,(BN_CTX *)0x0);
              local_b8.data_._0_4_ = CONCAT31(local_b8.data_._1_3_,iVar2 != 0);
              local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_a8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_a0,(internal *)&local_b8,
                           (AssertionResult *)"EC_POINT_invert(group(), q.get(), nullptr)","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_68,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x287,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_68,(Message *)&local_a8);
                goto LAB_002e544d;
              }
              local_b8.data_._0_4_ = 1;
              iVar2 = EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)local_80._M_head_impl,b,(BN_CTX *)0x0);
              local_a8._M_head_impl._0_4_ = iVar2;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_a0,"1","EC_POINT_cmp(group(), q.get(), pub2, nullptr)",
                         (int *)&local_b8,(int *)&local_a8);
              if (local_a0[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_b8);
                if (local_98 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = (local_98->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x288,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_a8,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
                if ((long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) + 8))();
                }
              }
              if (local_98 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_98,local_98);
              }
              iVar2 = EC_POINT_add((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)local_70._M_head_impl,
                                   (EC_POINT *)local_70._M_head_impl,
                                   (EC_POINT *)local_80._M_head_impl,(BN_CTX *)0x0);
              local_b8.data_._0_4_ = CONCAT31(local_b8.data_._1_3_,iVar2 != 0);
              local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_a8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_a0,(internal *)&local_b8,
                           (AssertionResult *)
                           "EC_POINT_add(group(), p.get(), p.get(), q.get(), nullptr)","false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_68,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x28b,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_68,(Message *)&local_a8);
                goto LAB_002e544d;
              }
              local_b8.data_._0_4_ = 0;
              iVar2 = EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)local_70._M_head_impl,(EC_POINT *)p_00,(BN_CTX *)0x0)
              ;
              local_a8._M_head_impl._0_4_ = iVar2;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_a0,"0","EC_POINT_cmp(group(), p.get(), pub1, nullptr)",
                         (int *)&local_b8,(int *)&local_a8);
              if (local_a0[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_b8);
                if (local_98 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = (local_98->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x28c,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_a8,(Message *)&local_b8);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
                if ((long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) + 8))();
                }
              }
              if (local_98 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_98,local_98);
              }
              local_a8._M_head_impl =
                   (ec_point_st *)EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
              local_68._M_head_impl =
                   (ec_point_st *)EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
              local_b8.data_._0_4_ =
                   CONCAT31(local_b8.data_._1_3_,local_a8._M_head_impl != (ec_point_st *)0x0);
              local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (local_a8._M_head_impl == (ec_point_st *)0x0) {
                testing::Message::Message((Message *)&local_78);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_a0,(internal *)&local_b8,(AssertionResult *)"inf1",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_60,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                           ,0x291,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
                testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
LAB_002e578c:
                this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_b0;
                testing::internal::AssertHelper::~AssertHelper(&local_60);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_a0._1_7_,local_a0[0]),
                                  local_90._M_allocated_capacity + 1);
                }
                if ((long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) + 8))();
                }
                local_98 = local_b0;
                if (local_b0 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
LAB_002e57ce:
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()(this_00,local_98);
                }
              }
              else {
                local_b8.data_._0_4_ =
                     CONCAT31(local_b8.data_._1_3_,local_68._M_head_impl != (ec_point_st *)0x0);
                local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (local_68._M_head_impl == (ec_point_st *)0x0) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_a0,(internal *)&local_b8,(AssertionResult *)"inf2",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x292,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
                  goto LAB_002e578c;
                }
                iVar2 = EC_POINT_set_to_infinity
                                  ((EC_GROUP *)(this->super_ECCurveTest).group_,
                                   (EC_POINT *)local_a8._M_head_impl);
                local_b8.data_._0_4_ = CONCAT31(local_b8.data_._1_3_,iVar2 != 0);
                local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar2 == 0) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_a0,(internal *)&local_b8,
                             (AssertionResult *)"EC_POINT_set_to_infinity(group(), inf1.get())",
                             "false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x293,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
                  goto LAB_002e578c;
                }
                iVar2 = EC_POINT_add((EC_GROUP *)(this->super_ECCurveTest).group_,
                                     (EC_POINT *)local_68._M_head_impl,b,
                                     (EC_POINT *)local_80._M_head_impl,(BN_CTX *)0x0);
                local_b8.data_._0_4_ = CONCAT31(local_b8.data_._1_3_,iVar2 != 0);
                local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar2 == 0) {
                  testing::Message::Message((Message *)&local_78);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_a0,(internal *)&local_b8,
                             (AssertionResult *)
                             "EC_POINT_add(group(), inf2.get(), pub2, q.get(), nullptr)","false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_60,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x295,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
                  testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_78);
                  goto LAB_002e578c;
                }
                local_b8.data_._0_4_ = 0;
                local_78.data_._0_4_ =
                     EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                  (EC_POINT *)local_a8._M_head_impl,
                                  (EC_POINT *)local_68._M_head_impl,(BN_CTX *)0x0);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_a0,"0",
                           "EC_POINT_cmp(group(), inf1.get(), inf2.get(), nullptr)",(int *)&local_b8
                           ,(int *)&local_78);
                if (local_a0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_b8);
                  if (local_98 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = (local_98->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_78,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x296,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_78);
                  if ((long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) + 8))()
                    ;
                  }
                }
                if (local_98 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_98,local_98);
                }
                local_b8.data_._0_4_ = 1;
                local_78.data_._0_4_ =
                     EC_POINT_cmp((EC_GROUP *)(this->super_ECCurveTest).group_,
                                  (EC_POINT *)local_a8._M_head_impl,
                                  (EC_POINT *)local_70._M_head_impl,(BN_CTX *)0x0);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)local_a0,"1",
                           "EC_POINT_cmp(group(), inf1.get(), p.get(), nullptr)",(int *)&local_b8,
                           (int *)&local_78);
                if (local_a0[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_b8);
                  if (local_98 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = (local_98->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_78,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                             ,0x297,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_78);
                  if ((long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) + 8))()
                    ;
                  }
                }
                if (local_98 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_98;
                  goto LAB_002e57ce;
                }
              }
              std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_68);
              std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_a8);
            }
            std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_80);
          }
          std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_70);
        }
        else {
          testing::Message::Message((Message *)&local_70);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_a0,(internal *)&local_b8,
                     (AssertionResult *)
                     "EncodeECPoint(&serialized, group(), pub1, POINT_CONVERSION_UNCOMPRESSED)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_80,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x275,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_70)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_a0._1_7_,local_a0[0]),
                            local_90._M_allocated_capacity + 1);
          }
          if (local_70._M_head_impl != (ec_point_st *)0x0) {
            (*(code *)((local_70._M_head_impl)->group->generator).group)();
          }
          if (local_b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_b0,local_b0);
          }
          if (bVar1) goto LAB_002e4d84;
        }
        if (local_58 != (undefined1  [8])0x0) {
          operator_delete((void *)local_58,(long)local_48 - (long)local_58);
        }
      }
      std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&local_38);
      goto LAB_002e581f;
    }
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)local_58,
               (AssertionResult *)"EC_KEY_generate_key(key1.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x266,(char *)CONCAT71(local_a0._1_7_,local_a0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_b8);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_a0._1_7_,local_a0[0]) != &local_90) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_a0._1_7_,local_a0[0]),local_90._M_allocated_capacity + 1);
  }
  if ((long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,(int)local_b8.data_) + 8))();
  }
  if (pbStack_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_50,pbStack_50);
  }
LAB_002e581f:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&local_30);
  return;
}

Assistant:

TEST_P(ECCurveTest, Compare) {
  bssl::UniquePtr<EC_KEY> key1(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key1);
  ASSERT_TRUE(EC_KEY_generate_key(key1.get()));
  const EC_POINT *pub1 = EC_KEY_get0_public_key(key1.get());

  bssl::UniquePtr<EC_KEY> key2(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key2);
  ASSERT_TRUE(EC_KEY_generate_key(key2.get()));
  const EC_POINT *pub2 = EC_KEY_get0_public_key(key2.get());

  // Two different points should not compare as equal.
  EXPECT_EQ(1, EC_POINT_cmp(group(), pub1, pub2, nullptr));

  // Serialize |pub1| and parse it back out. This gives a point in affine
  // coordinates.
  std::vector<uint8_t> serialized;
  ASSERT_TRUE(
      EncodeECPoint(&serialized, group(), pub1, POINT_CONVERSION_UNCOMPRESSED));
  bssl::UniquePtr<EC_POINT> p(EC_POINT_new(group()));
  ASSERT_TRUE(p);
  ASSERT_TRUE(EC_POINT_oct2point(group(), p.get(), serialized.data(),
                                 serialized.size(), nullptr));

  // The points should be equal.
  EXPECT_EQ(0, EC_POINT_cmp(group(), p.get(), pub1, nullptr));

  // Add something to the point. It no longer compares as equal.
  ASSERT_TRUE(EC_POINT_add(group(), p.get(), p.get(), pub2, nullptr));
  EXPECT_EQ(1, EC_POINT_cmp(group(), p.get(), pub1, nullptr));

  // Negate |pub2|. It should no longer compare as equal. This tests that we
  // check both x and y coordinate.
  bssl::UniquePtr<EC_POINT> q(EC_POINT_new(group()));
  ASSERT_TRUE(q);
  ASSERT_TRUE(EC_POINT_copy(q.get(), pub2));
  ASSERT_TRUE(EC_POINT_invert(group(), q.get(), nullptr));
  EXPECT_EQ(1, EC_POINT_cmp(group(), q.get(), pub2, nullptr));

  // Return |p| to the original value. It should be equal to |pub1| again.
  ASSERT_TRUE(EC_POINT_add(group(), p.get(), p.get(), q.get(), nullptr));
  EXPECT_EQ(0, EC_POINT_cmp(group(), p.get(), pub1, nullptr));

  // Infinity compares as equal to itself, but not other points.
  bssl::UniquePtr<EC_POINT> inf1(EC_POINT_new(group())),
      inf2(EC_POINT_new(group()));
  ASSERT_TRUE(inf1);
  ASSERT_TRUE(inf2);
  ASSERT_TRUE(EC_POINT_set_to_infinity(group(), inf1.get()));
  // |q| is currently -|pub2|.
  ASSERT_TRUE(EC_POINT_add(group(), inf2.get(), pub2, q.get(), nullptr));
  EXPECT_EQ(0, EC_POINT_cmp(group(), inf1.get(), inf2.get(), nullptr));
  EXPECT_EQ(1, EC_POINT_cmp(group(), inf1.get(), p.get(), nullptr));
}